

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KNNValidatorTests.cpp
# Opt level: O1

void CoreML::KNNValidatorTests::generateInterface(Model *m1)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  ModelDescription *pMVar3;
  Metadata *pMVar4;
  Type *pTVar5;
  FeatureType *pFVar6;
  ArrayFeatureType *pAVar7;
  StringFeatureType *this;
  string local_48;
  
  m1->specificationversion_ = 5;
  if (m1->description_ == (ModelDescription *)0x0) {
    pMVar3 = (ModelDescription *)operator_new(0x78);
    Specification::ModelDescription::ModelDescription(pMVar3);
    m1->description_ = pMVar3;
  }
  pMVar3 = m1->description_;
  if (pMVar3->metadata_ == (Metadata *)0x0) {
    pMVar4 = (Metadata *)operator_new(0x58);
    Specification::Metadata::Metadata(pMVar4);
    pMVar3->metadata_ = pMVar4;
  }
  pMVar4 = pMVar3->metadata_;
  paVar1 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"Testing nearest neighbor validator","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pMVar4->shortdescription_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,&local_48)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&(pMVar3->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pFVar6 = (FeatureType *)operator_new(0x28);
  Specification::FeatureType::FeatureType(pFVar6);
  if (pFVar6->_oneof_case_[0] != 5) {
    Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    pAVar7 = (ArrayFeatureType *)operator_new(0x48);
    Specification::ArrayFeatureType::ArrayFeatureType(pAVar7);
    (pFVar6->Type_).multiarraytype_ = pAVar7;
  }
  pAVar7 = (pFVar6->Type_).multiarraytype_;
  iVar2 = (pAVar7->shape_).total_size_;
  if ((pAVar7->shape_).current_size_ == iVar2) {
    google::protobuf::RepeatedField<long>::Reserve(&pAVar7->shape_,iVar2 + 1);
  }
  iVar2 = (pAVar7->shape_).current_size_;
  (pAVar7->shape_).current_size_ = iVar2 + 1;
  ((pAVar7->shape_).rep_)->elements[iVar2] = 4;
  if (pFVar6->_oneof_case_[0] != 5) {
    Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    pAVar7 = (ArrayFeatureType *)operator_new(0x48);
    Specification::ArrayFeatureType::ArrayFeatureType(pAVar7);
    (pFVar6->Type_).multiarraytype_ = pAVar7;
  }
  ((pFVar6->Type_).multiarraytype_)->datatype_ = 0x10020;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"input","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar5->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,&local_48)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (pTVar5->type_ != (FeatureType *)0x0) {
    (*(pTVar5->type_->super_MessageLite)._vptr_MessageLite[1])();
  }
  pTVar5->type_ = pFVar6;
  pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&(pMVar3->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pFVar6 = (FeatureType *)operator_new(0x28);
  Specification::FeatureType::FeatureType(pFVar6);
  if (pFVar6->_oneof_case_[0] != 3) {
    Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 3;
    this = (StringFeatureType *)operator_new(0x18);
    Specification::StringFeatureType::StringFeatureType(this);
    (pFVar6->Type_).stringtype_ = this;
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"output","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar5->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,&local_48)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (pTVar5->type_ != (FeatureType *)0x0) {
    (*(pTVar5->type_->super_MessageLite)._vptr_MessageLite[1])();
  }
  pTVar5->type_ = pFVar6;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"output","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pMVar3->predictedfeaturename_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,&local_48)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void generateInterface(Specification::Model& m1) {

        m1.set_specificationversion(MLMODEL_SPECIFICATION_VERSION);
        Specification::ModelDescription* interface = m1.mutable_description();
        Specification::Metadata* metadata = interface->mutable_metadata();
        metadata->set_shortdescription(std::string("Testing nearest neighbor validator"));

        Specification::FeatureDescription *input = interface->add_input();
        Specification::FeatureType* inputType = new Specification::FeatureType;
        inputType->mutable_multiarraytype()->mutable_shape()->Add(4);
        inputType->mutable_multiarraytype()->set_datatype(::CoreML::Specification::ArrayFeatureType_ArrayDataType_FLOAT32);
        input->set_name("input");
        input->set_allocated_type(inputType);

        Specification::FeatureDescription *output = interface->add_output();
        Specification::FeatureType* outputType = new Specification::FeatureType;
        outputType->mutable_stringtype();
        output->set_name("output");
        output->set_allocated_type(outputType);
        
        interface->set_predictedfeaturename("output");

    }